

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# baseline_solver.cpp
# Opt level: O2

void __thiscall
despot::ScenarioBaselineSolver::~ScenarioBaselineSolver(ScenarioBaselineSolver *this)

{
  ~ScenarioBaselineSolver(this);
  operator_delete(this,0x50);
  return;
}

Assistant:

ValuedAction ScenarioBaselineSolver::Search() {
	RandomStreams streams(Globals::config.num_scenarios,
		Globals::config.search_depth);
	vector<State*> particles = belief_->Sample(Globals::config.num_scenarios);

	ValuedAction va = lb_solver_->Value(particles, streams, history_);

	for (int i = 0; i < particles.size(); i++)
		model_->Free(particles[i]);

	return va;
}